

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  float fVar1;
  char cVar2;
  uint uVar3;
  ImDrawIdx *pIVar4;
  ImDrawVert *pIVar5;
  char *pcVar6;
  int iVar7;
  size_t sVar8;
  void *pvVar9;
  char *pcVar10;
  ImFontGlyph *pIVar11;
  ImDrawCmd *pIVar12;
  int iVar13;
  char *pcVar14;
  char *pcVar15;
  ImDrawIdx IVar16;
  char *text_end_00;
  float fVar17;
  float fVar18;
  float fVar19;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float local_cc;
  uint c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  ulong local_80;
  ImDrawIdx *local_78;
  ImDrawVert *local_70;
  int local_64;
  int local_60;
  ImU32 local_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  char *local_40;
  ImVector<unsigned_short> *local_38;
  
  fVar18 = pos.x;
  fVar17 = pos.y;
  local_5c = col;
  if (text_end == (char *)0x0) {
    fStack_90 = in_XMM1_Dc;
    local_98 = pos;
    fStack_8c = in_XMM1_Dd;
    sVar8 = strlen(text_begin);
    text_end = text_begin + sVar8;
    fVar18 = (float)local_98._0_4_;
    fVar17 = (float)local_98._4_4_;
    in_XMM1_Dc = fStack_90;
    in_XMM1_Dd = fStack_8c;
  }
  fVar20 = (float)(int)fVar17 + (this->DisplayOffset).y;
  fVar22 = clip_rect->w;
  if (fVar20 <= fVar22) {
    fStack_54 = (float)(int)fVar17;
    fStack_50 = (float)(int)in_XMM1_Dc;
    fStack_4c = (float)(int)in_XMM1_Dd;
    local_58 = (float)(int)fVar18 + (this->DisplayOffset).x;
    fVar17 = size / this->FontSize;
    fVar18 = this->FontSize * fVar17;
    local_98._0_4_ = fVar18;
    if ((wrap_width <= 0.0) && (fVar29 = clip_rect->y, fVar20 + fVar18 < fVar29)) {
      while ((fVar19 = fVar18 + fVar20, fVar19 < fVar29 && (text_begin < text_end))) {
        pvVar9 = memchr(text_begin,10,(long)text_end - (long)text_begin);
        text_begin = (char *)((long)pvVar9 + 1);
        fVar18 = (float)local_98._0_4_;
        fVar20 = fVar19;
        if (pvVar9 == (void *)0x0) {
          text_begin = text_end;
        }
      }
    }
    text_end_00 = text_end;
    if ((wrap_width <= 0.0) &&
       (pcVar10 = text_begin, fVar18 = fVar20, 10000 < (long)text_end - (long)text_begin)) {
      while ((text_end_00 = pcVar10, fVar18 < fVar22 && (pcVar10 < text_end))) {
        pvVar9 = memchr(pcVar10,10,(long)text_end - (long)pcVar10);
        pcVar10 = (char *)((long)pvVar9 + 1);
        if (pvVar9 == (void *)0x0) {
          pcVar10 = text_end;
        }
        fVar18 = fVar18 + (float)local_98._0_4_;
      }
    }
    if (text_begin != text_end_00) {
      iVar13 = (int)text_end_00 - (int)text_begin;
      local_60 = iVar13 * 6;
      local_38 = &draw_list->IdxBuffer;
      local_64 = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_60,iVar13 * 4);
      local_70 = draw_list->_VtxWritePtr;
      local_78 = draw_list->_IdxWritePtr;
      local_80 = (ulong)draw_list->_VtxCurrentIdx;
      local_40 = (char *)0x0;
      local_cc = local_58;
      pcVar10 = local_40;
      fVar18 = (float)local_98._0_4_;
      fVar22 = local_58;
      fVar29 = fVar20;
      pcVar14 = text_begin;
LAB_0015769f:
      do {
        if (text_end_00 <= text_begin) break;
        pcVar15 = pcVar14;
        fVar19 = fVar29;
        fVar1 = local_cc;
        pcVar6 = local_40;
        if (0.0 < wrap_width) {
          if (pcVar10 == (char *)0x0) {
            pcVar10 = CalcWordWrapPositionA
                                (this,fVar17,text_begin,text_end_00,(local_58 - fVar22) + wrap_width
                                );
            pcVar10 = pcVar10 + (pcVar10 == text_begin);
            fVar18 = (float)local_98._0_4_;
          }
          pcVar15 = text_begin;
          fVar19 = fVar20;
          fVar1 = fVar22;
          pcVar6 = pcVar10;
          if (pcVar10 <= text_begin) {
            fVar20 = fVar20 + fVar18;
            pcVar10 = text_begin;
            do {
              text_begin = pcVar10;
              fVar22 = local_58;
              if (text_end_00 <= text_begin) {
                pcVar10 = (char *)0x0;
                goto LAB_0015769f;
              }
              cVar2 = *text_begin;
              pcVar10 = text_begin + 1;
            } while ((cVar2 == '\t') || (cVar2 == ' '));
            pcVar15 = text_begin + 1;
            if (cVar2 != '\n') {
              pcVar15 = text_begin;
            }
            pcVar10 = (char *)0x0;
            text_begin = pcVar15;
            goto LAB_0015769f;
          }
        }
        local_40 = pcVar6;
        local_cc = fVar1;
        fVar20 = fVar19;
        c = (uint)*pcVar15;
        if (*pcVar15 < '\0') {
          iVar13 = ImTextCharFromUtf8(&c,pcVar15,text_end_00);
          if (c == 0) break;
          text_begin = pcVar15 + iVar13;
          fVar18 = (float)local_98._0_4_;
        }
        else {
          text_begin = pcVar15 + 1;
        }
        uVar3 = c;
        fVar29 = fVar20;
        pcVar14 = text_begin;
        if (0x1f < c) {
LAB_001577fc:
          pIVar11 = FindGlyph(this,(ImWchar)c);
          if (pIVar11 == (ImFontGlyph *)0x0) {
            fVar18 = 0.0;
          }
          else {
            fVar18 = pIVar11->AdvanceX * fVar17;
            if ((uVar3 != 9) && (uVar3 != 0x20)) {
              fVar19 = pIVar11->X0 * fVar17 + local_cc;
              fVar22 = clip_rect->z;
              if (fVar19 <= fVar22) {
                fVar27 = pIVar11->X1 * fVar17 + local_cc;
                fVar1 = clip_rect->x;
                if (fVar1 <= fVar27) {
                  fVar28 = pIVar11->Y0 * fVar17 + fVar20;
                  fVar24 = pIVar11->Y1 * fVar17 + fVar20;
                  fVar21 = pIVar11->U0;
                  fVar26 = pIVar11->V0;
                  fVar25 = pIVar11->U1;
                  fVar23 = pIVar11->V1;
                  if (cpu_fine_clip) {
                    if (fVar19 < fVar1) {
                      fVar21 = fVar21 + (fVar25 - fVar21) *
                                        (1.0 - (fVar27 - fVar1) / (fVar27 - fVar19));
                      fVar19 = fVar1;
                    }
                    fVar1 = clip_rect->y;
                    if (fVar28 < fVar1) {
                      fVar26 = fVar26 + (fVar23 - fVar26) *
                                        (1.0 - (fVar24 - fVar1) / (fVar24 - fVar28));
                      fVar28 = fVar1;
                    }
                    if (fVar22 < fVar27) {
                      fVar25 = (fVar25 - fVar21) * ((fVar22 - fVar19) / (fVar27 - fVar19)) + fVar21;
                      fVar27 = fVar22;
                    }
                    fVar22 = clip_rect->w;
                    if (fVar22 < fVar24) {
                      fVar23 = (fVar23 - fVar26) * ((fVar22 - fVar28) / (fVar24 - fVar28)) + fVar26;
                      fVar24 = fVar22;
                    }
                    if (fVar24 <= fVar28) goto LAB_00157922;
                  }
                  IVar16 = (ImDrawIdx)local_80;
                  *local_78 = IVar16;
                  local_78[1] = IVar16 + 1;
                  local_78[2] = IVar16 + 2;
                  local_78[3] = IVar16;
                  local_78[4] = IVar16 + 2;
                  local_78[5] = IVar16 + 3;
                  (local_70->pos).x = fVar19;
                  (local_70->pos).y = fVar28;
                  local_70->col = local_5c;
                  (local_70->uv).x = fVar21;
                  (local_70->uv).y = fVar26;
                  local_70[1].pos.x = fVar27;
                  local_70[1].pos.y = fVar28;
                  local_70[1].col = local_5c;
                  local_70[1].uv.x = fVar25;
                  local_70[1].uv.y = fVar26;
                  local_70[2].pos.x = fVar27;
                  local_70[2].pos.y = fVar24;
                  local_70[2].col = local_5c;
                  local_70[2].uv.x = fVar25;
                  local_70[2].uv.y = fVar23;
                  local_70[3].pos.x = fVar19;
                  local_70[3].pos.y = fVar24;
                  local_70[3].col = local_5c;
                  local_70[3].uv.x = fVar21;
                  local_70[3].uv.y = fVar23;
                  local_70 = local_70 + 4;
                  local_80 = (ulong)((int)local_80 + 4);
                  local_78 = local_78 + 6;
                }
              }
            }
          }
LAB_00157922:
          local_cc = local_cc + fVar18;
          pcVar10 = local_40;
          fVar18 = (float)local_98._0_4_;
          fVar22 = local_cc;
          goto LAB_0015769f;
        }
        pcVar10 = local_40;
        if (c != 10) {
          fVar22 = local_cc;
          if (c != 0xd) goto LAB_001577fc;
          goto LAB_0015769f;
        }
        fVar20 = fVar20 + fVar18;
        local_cc = local_58;
        fVar22 = local_58;
        fVar29 = fVar20;
      } while (fVar20 < clip_rect->w || fVar20 == clip_rect->w);
      pIVar5 = local_70;
      ImVector<ImDrawVert>::resize
                (&draw_list->VtxBuffer,
                 (int)(((long)local_70 - (long)(draw_list->VtxBuffer).Data) / 0x14));
      pIVar4 = local_78;
      ImVector<unsigned_short>::resize
                (local_38,(int)((ulong)((long)local_78 - (long)(draw_list->IdxBuffer).Data) >> 1));
      iVar13 = (draw_list->IdxBuffer).Size;
      iVar7 = local_64 + local_60;
      pIVar12 = ImVector<ImDrawCmd>::operator[]
                          (&draw_list->CmdBuffer,(draw_list->CmdBuffer).Size + -1);
      pIVar12->ElemCount = pIVar12->ElemCount + (iVar13 - iVar7);
      draw_list->_VtxWritePtr = pIVar5;
      draw_list->_IdxWritePtr = pIVar4;
      draw_list->_VtxCurrentIdx = (uint)local_80;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = (float)(int)pos.x + DisplayOffset.x;
    pos.y = (float)(int)pos.y + DisplayOffset.y;
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        float char_width = 0.0f;
        if (const ImFontGlyph* glyph = FindGlyph((ImWchar)c))
        {
            char_width = glyph->AdvanceX * scale;

            // Arbitrarily assume that both space and tabs are empty glyphs as an optimization
            if (c != ' ' && c != '\t')
            {
                // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
                float x1 = x + glyph->X0 * scale;
                float x2 = x + glyph->X1 * scale;
                float y1 = y + glyph->Y0 * scale;
                float y2 = y + glyph->Y1 * scale;
                if (x1 <= clip_rect.z && x2 >= clip_rect.x)
                {
                    // Render a character
                    float u1 = glyph->U0;
                    float v1 = glyph->V0;
                    float u2 = glyph->U1;
                    float v2 = glyph->V1;

                    // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                    if (cpu_fine_clip)
                    {
                        if (x1 < clip_rect.x)
                        {
                            u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                            x1 = clip_rect.x;
                        }
                        if (y1 < clip_rect.y)
                        {
                            v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                            y1 = clip_rect.y;
                        }
                        if (x2 > clip_rect.z)
                        {
                            u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                            x2 = clip_rect.z;
                        }
                        if (y2 > clip_rect.w)
                        {
                            v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                            y2 = clip_rect.w;
                        }
                        if (y1 >= y2)
                        {
                            x += char_width;
                            continue;
                        }
                    }

                    // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                    {
                        idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                        idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                        vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                        vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                        vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                        vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                        vtx_write += 4;
                        vtx_current_idx += 4;
                        idx_write += 6;
                    }
                }
            }
        }

        x += char_width;
    }

    // Give back unused vertices
    draw_list->VtxBuffer.resize((int)(vtx_write - draw_list->VtxBuffer.Data));
    draw_list->IdxBuffer.resize((int)(idx_write - draw_list->IdxBuffer.Data));
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size-1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}